

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VDotProdMulti(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  realtype rVar1;
  int local_2c;
  int i;
  realtype *dotprods_local;
  N_Vector *Y_local;
  N_Vector x_local;
  int nvec_local;
  
  if (x->ops->nvdotprodmulti == (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0) {
    for (local_2c = 0; local_2c < nvec; local_2c = local_2c + 1) {
      rVar1 = (*x->ops->nvdotprod)(x,Y[local_2c]);
      dotprods[local_2c] = rVar1;
    }
    x_local._4_4_ = 0;
  }
  else {
    x_local._4_4_ = (*x->ops->nvdotprodmulti)(nvec,x,Y,dotprods);
  }
  return x_local._4_4_;
}

Assistant:

int N_VDotProdMulti(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int i;

  if (x->ops->nvdotprodmulti != NULL) {
    
    return(x->ops->nvdotprodmulti(nvec, x, Y, dotprods));

  } else {

    for (i=0; i<nvec; i++) {
      dotprods[i] = x->ops->nvdotprod(x, Y[i]);
    }
    return(0);

  }
}